

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_http_request.cc
# Opt level: O0

void __thiscall AliHttpRequest::AliHttpRequest(AliHttpRequest *this,string *url)

{
  http_parser *phVar1;
  string *url_local;
  AliHttpRequest *this_local;
  
  this->_vptr_AliHttpRequest = (_func_int **)&PTR_CommitRequest_00223e10;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->map_request_headers_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->map_reponse_headers_);
  std::__cxx11::string::string((string *)&this->method_);
  std::__cxx11::string::string((string *)&this->url_);
  std::__cxx11::string::string((string *)&this->query_);
  std::__cxx11::string::string((string *)&this->flagment_);
  std::__cxx11::string::string((string *)&this->host_);
  std::__cxx11::string::string((string *)&this->port_);
  std::__cxx11::string::string((string *)&this->path_);
  std::__cxx11::string::string((string *)&this->sechema_);
  std::__cxx11::string::string((string *)&this->resposne_body_);
  std::__cxx11::string::string((string *)&this->proxy_host_);
  std::__cxx11::string::string((string *)&this->last_response_field_);
  std::__cxx11::string::string((string *)&this->last_response_value_);
  std::__cxx11::string::operator=((string *)&this->method_,"GET");
  std::__cxx11::string::operator=((string *)&this->port_,"80");
  std::__cxx11::string::operator=((string *)&this->url_,(string *)url);
  this->is_tls = false;
  this->is_last_value_ = false;
  this->is_response_complete = false;
  this->is_response_header_complete = false;
  this->connection_ = (AliConnection *)0x0;
  phVar1 = (http_parser *)calloc(1,0x20);
  this->parser_ = phVar1;
  ParseUrl(this);
  return;
}

Assistant:

AliHttpRequest::AliHttpRequest(std::string url) {
  this->method_ = "GET";
  this->port_ = "80";
  this->url_ = url;
  this->is_tls = false;
  this->is_last_value_ = false;
  this->is_response_complete = false;
  this->is_response_header_complete = false;
  this->connection_ = NULL;
  parser_ = (http_parser*)calloc(1, sizeof(http_parser));
  this->ParseUrl();
}